

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::HeapArgumentsObject::HasPropertyQuery
          (HeapArgumentsObject *this,PropertyId id,PropertyValueInfo *info)

{
  BOOL BVar1;
  PropertyQueryFlags PVar2;
  undefined8 in_RAX;
  uint local_24 [2];
  uint32 index;
  
  local_24[0] = (uint)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr,id,local_24);
  if ((BVar1 == 0) || ((*(uint *)&this->field_0x20 & 0x7fffffff) <= local_24[0])) {
    PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,id,info);
  }
  else {
    PVar2 = HasItemQuery(this,local_24[0]);
  }
  return PVar2;
}

Assistant:

PropertyQueryFlags HeapArgumentsObject::HasPropertyQuery(PropertyId id, _Inout_opt_ PropertyValueInfo* info)
    {
        ScriptContext *scriptContext = GetScriptContext();

        // Try to get a numbered property that maps to an actual argument.
        uint32 index;
        if (scriptContext->IsNumericPropertyId(id, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            return HeapArgumentsObject::HasItemQuery(index);
        }

        return DynamicObject::HasPropertyQuery(id, info);
    }